

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11GlxPlatform.cpp
# Opt level: O1

GlxDrawable * tcu::x11::glx::createDrawable(GlxVisual *visual,RenderConfig *config)

{
  SurfaceType SVar1;
  GlxWindow *this;
  NotSupportedError *this_00;
  
  SVar1 = (uint)(visual->m_visual == (Visual *)0x0) * 2;
  if (config->surfaceType != SURFACETYPE_DONT_CARE) {
    SVar1 = config->surfaceType;
  }
  if (SVar1 < SURFACETYPE_OFFSCREEN_NATIVE) {
    this = (GlxWindow *)operator_new(0x40);
    GlxWindow::GlxWindow(this,visual,config);
    return &this->super_GlxDrawable;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  NotSupportedError::NotSupportedError
            (this_00,"Unsupported surface type",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/platform/X11/tcuX11GlxPlatform.cpp"
             ,0x28f);
  __cxa_throw(this_00,&NotSupportedError::typeinfo,Exception::~Exception);
}

Assistant:

GlxDrawable* createDrawable (GlxVisual& visual, const RenderConfig& config)
{
	RenderConfig::SurfaceType surfaceType = config.surfaceType;

	if (surfaceType == RenderConfig::SURFACETYPE_DONT_CARE)
	{
		if (visual.getXVisual() == DE_NULL)
			// No visual, cannot create X window
			surfaceType = RenderConfig::SURFACETYPE_OFFSCREEN_NATIVE;
		else
			surfaceType = RenderConfig::SURFACETYPE_WINDOW;
	}

	switch (surfaceType)
	{
		case RenderConfig::SURFACETYPE_DONT_CARE:
			DE_FATAL("Impossible case");

		case RenderConfig::SURFACETYPE_WINDOW:
			return new GlxWindow(visual, config);
			break;

		case RenderConfig::SURFACETYPE_OFFSCREEN_NATIVE:
			// \todo [2013-11-28 lauri] Pixmaps

		case RenderConfig::SURFACETYPE_OFFSCREEN_GENERIC:
			// \todo [2013-11-28 lauri] Pbuffers

		default:
			TCU_THROW(NotSupportedError, "Unsupported surface type");
	}

	return DE_NULL;
}